

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * columnTypeImpl(NameContext *pNC,Expr *pExpr)

{
  int iVar1;
  SrcList *pSVar2;
  Table *pTVar3;
  char *pcVar4;
  Select *pSVar5;
  uint uVar6;
  int *piVar7;
  Expr *pExpr_00;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  NameContext sNC;
  NameContext local_48;
  
  if (pExpr->op == 0x8a) {
    local_48.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_00179551:
    local_48.pParse = pNC->pParse;
    local_48.pNext = pNC;
    pcVar4 = columnTypeImpl(&local_48,pExpr_00);
  }
  else {
    if (pExpr->op == 0xa7) {
      if (pNC == (NameContext *)0x0) {
        bVar10 = true;
        pSVar5 = (Select *)0x0;
        pTVar3 = (Table *)0x0;
      }
      else {
        pTVar3 = (Table *)0x0;
        pSVar5 = (Select *)0x0;
        do {
          pSVar2 = pNC->pSrcList;
          uVar8 = (ulong)pSVar2->nSrc;
          bVar10 = 0 < (long)uVar8;
          if ((long)uVar8 < 1) {
LAB_00179524:
            pNC = pNC->pNext;
          }
          else {
            if (pSVar2->a[0].iCursor == pExpr->iTable) {
              uVar9 = 0;
            }
            else {
              uVar9 = 0;
              piVar7 = &pSVar2[1].a[0].regResult;
              do {
                if (uVar8 - 1 == uVar9) goto LAB_00179524;
                uVar9 = uVar9 + 1;
                iVar1 = *piVar7;
                piVar7 = piVar7 + 0x1a;
              } while (iVar1 != pExpr->iTable);
              bVar10 = uVar9 < uVar8;
            }
            if (!bVar10) goto LAB_00179524;
            pTVar3 = pSVar2->a[uVar9].pTab;
            pSVar5 = pSVar2->a[uVar9].pSelect;
          }
          bVar10 = pTVar3 == (Table *)0x0;
        } while ((pNC != (NameContext *)0x0) && (pTVar3 == (Table *)0x0));
      }
      if (!bVar10) {
        uVar6 = (uint)pExpr->iColumn;
        if (pSVar5 == (Select *)0x0) {
          if (pExpr->iColumn < 0) {
            return "INTEGER";
          }
          pcVar4 = sqlite3ColumnType(pTVar3->aCol + uVar6,(char *)0x0);
          return pcVar4;
        }
        if ((int)uVar6 < pSVar5->pEList->nExpr) {
          local_48.pSrcList = pSVar5->pSrc;
          pExpr_00 = pSVar5->pEList->a[(int)uVar6].pExpr;
          goto LAB_00179551;
        }
      }
    }
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC,
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && ExprUseYTab(pExpr) && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol<pS->pEList->nExpr
         && (!ViewCanHaveRowid || iCol>=0)
        ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol);
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zCnName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS;
      Expr *p;
      assert( ExprUseXSelect(pExpr) );
      pS = pExpr->x.pSelect;
      p = pS->pEList->a[0].pExpr;
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}